

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O0

void my_deserialization_example(ChArchiveIn *marchive)

{
  double dVar1;
  bool bVar2;
  ChVector<double> *this;
  ChStreamOutAscii *pCVar3;
  char *pcVar4;
  long lVar5;
  reference ppCVar6;
  char cVar7;
  char in_R9B;
  long local_6d0;
  ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
  local_498;
  ChVector<double> *local_480;
  ChVector<double> *mvp1;
  vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> vect_of_pointers;
  myEmployeeCustomConstructor *local_448;
  myEmployeeCustomConstructor *mcustomconstr;
  undefined1 local_428 [8];
  shared_ptr<myEmployeeBoss> null_boss;
  undefined1 local_400 [8];
  shared_ptr<myEmployeeBoss> s_boss_b;
  undefined1 local_3d8 [8];
  shared_ptr<myEmployeeBoss> s_boss;
  myEmployee *local_3b0;
  myEmployee *a_boss2;
  myEmployee *local_390;
  myEmployee *a_boss;
  ChNameValue<chrono::ChVector<double>_*> local_370;
  ChNameValue<myEmployeeBoss> local_358;
  ChNameValue<chrono::ChQuaternion<double>_> local_340;
  ChNameValue<chrono::ChVector<double>_> local_328;
  ChNameValue<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> local_310;
  ChNameValue<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_2f8;
  ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  local_2e0;
  ChNameValue<std::pair<int,_double>_> local_2c8;
  ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_2b0;
  ChNameValue<std::vector<double,_std::allocator<double>_>_> local_298;
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  ChNameValue<char[12]> local_268;
  ChNameValue<double[3]> local_250;
  ChNameValue<int> local_238;
  ChNameValue<double> local_220;
  char local_208 [8];
  ChVector<double> *a_null_ptr;
  ChVector<double> *a_vect;
  myEmployeeBoss m_boss;
  ChQuaternion<double> m_quat;
  ChVector<double> m_vect;
  ChMatrixNM<double,_2,_3> m_matr_NM;
  ChMatrixDynamic<> m_matr_dyn;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  m_stlunorderedmap;
  undefined1 local_a8 [8];
  pair<int,_double> m_stlpair;
  list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> m_stllist;
  vector<double,_std::allocator<double>_> m_stlvector;
  string m_string;
  char m_text [12];
  double m_array [3];
  double dStack_18;
  int m_int;
  double m_double;
  ChArchiveIn *marchive_local;
  
  m_double = (double)marchive;
  std::__cxx11::string::string
            ((string *)
             &m_stlvector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &m_stllist.
              super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              ._M_impl._M_node._M_size);
  std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::list
            ((list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
             &m_stlpair.second);
  std::pair<int,_double>::pair<int,_double,_true>((pair<int,_double> *)local_a8);
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)&m_matr_dyn.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_1,__1,__1> *)
             (m_matr_NM.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>.m_storage.
              m_data.array + 5));
  Eigen::Matrix<double,_2,_3,_1,_2,_3>::Matrix((Matrix<double,_2,_3,_1,_2,_3> *)(m_vect.m_data + 2))
  ;
  chrono::ChVector<double>::ChVector((ChVector<double> *)(m_quat.m_data + 3));
  chrono::ChQuaternion<double>::ChQuaternion
            ((ChQuaternion<double> *)((long)&m_boss.slave.name.field_2 + 8));
  myEmployeeBoss::myEmployeeBoss((myEmployeeBoss *)&a_vect,0x26,9000.4,true);
  dVar1 = m_double;
  cVar7 = '\0';
  chrono::make_ChNameValue<double>
            (&local_220,"m_double",&stack0xffffffffffffffe8,"custom_double",'\0');
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_220);
  chrono::ChNameValue<double>::~ChNameValue(&local_220);
  dVar1 = m_double;
  chrono::make_ChNameValue<int>(&local_238,"m_int",(int *)((long)m_array + 0x14),'\0');
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_238);
  chrono::ChNameValue<int>::~ChNameValue(&local_238);
  dVar1 = m_double;
  chrono::make_ChNameValue<double[3]>(&local_250,"m_array",(double (*) [3])(m_text + 4),'\0');
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_250);
  chrono::ChNameValue<double[3]>::~ChNameValue(&local_250);
  dVar1 = m_double;
  chrono::make_ChNameValue<char[12]>
            (&local_268,"m_text",(char (*) [12])((long)&m_string.field_2 + 0xc),'\0');
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_268);
  chrono::ChNameValue<char[12]>::~ChNameValue(&local_268);
  dVar1 = m_double;
  chrono::make_ChNameValue<std::__cxx11::string>
            (&local_280,(chrono *)"m_string",
             (char *)&m_stlvector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0,cVar7);
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_280);
  chrono::
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~ChNameValue(&local_280);
  dVar1 = m_double;
  chrono::make_ChNameValue<std::vector<double,std::allocator<double>>>
            (&local_298,(chrono *)"m_stlvector",
             (char *)&m_stllist.
                      super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl._M_node._M_size,(vector<double,_std::allocator<double>_> *)0x0,cVar7)
  ;
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_298);
  chrono::ChNameValue<std::vector<double,_std::allocator<double>_>_>::~ChNameValue(&local_298);
  dVar1 = m_double;
  chrono::
  make_ChNameValue<std::__cxx11::list<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>>
            (&local_2b0,(chrono *)"m_stllist",(char *)&m_stlpair.second,
             (list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)0x0,cVar7
            );
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_2b0);
  chrono::
  ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  ::~ChNameValue(&local_2b0);
  dVar1 = m_double;
  chrono::make_ChNameValue<std::pair<int,double>>
            (&local_2c8,(chrono *)"m_stlpair",local_a8,(pair<int,_double> *)0x0,cVar7);
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_2c8);
  chrono::ChNameValue<std::pair<int,_double>_>::~ChNameValue(&local_2c8);
  dVar1 = m_double;
  chrono::
  make_ChNameValue<std::unordered_map<int,double,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,double>>>>
            (&local_2e0,(chrono *)"m_stlunorderedmap",
             (char *)&m_matr_dyn.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols,
             (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)0x0,cVar7);
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_2e0);
  chrono::
  ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  ::~ChNameValue(&local_2e0);
  dVar1 = m_double;
  chrono::make_ChNameValue<Eigen::Matrix<double,_1,_1,1,_1,_1>>
            (&local_2f8,(chrono *)"m_matr_dyn",
             (char *)(m_matr_NM.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>.
                      m_storage.m_data.array + 5),(Matrix<double,__1,__1,_1,__1,__1> *)0x0,cVar7);
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_2f8);
  chrono::ChNameValue<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::~ChNameValue(&local_2f8);
  dVar1 = m_double;
  chrono::make_ChNameValue<Eigen::Matrix<double,2,3,1,2,3>>
            (&local_310,(chrono *)"m_matr_NM",(char *)(m_vect.m_data + 2),
             (Matrix<double,_2,_3,_1,_2,_3> *)0x0,cVar7);
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_310);
  chrono::ChNameValue<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::~ChNameValue(&local_310);
  dVar1 = m_double;
  chrono::make_ChNameValue<chrono::ChVector<double>>
            (&local_328,(chrono *)"m_vect",(char *)(m_quat.m_data + 3),(ChVector<double> *)0x0,cVar7
            );
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_328);
  chrono::ChNameValue<chrono::ChVector<double>_>::~ChNameValue(&local_328);
  dVar1 = m_double;
  cVar7 = '\x01';
  chrono::make_ChNameValue<chrono::ChQuaternion<double>>
            (&local_340,(chrono *)"m_quat",m_boss.slave.name.field_2._M_local_buf + 8,
             (ChQuaternion<double> *)"m_quaternion",(char *)0x1,in_R9B);
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_340);
  chrono::ChNameValue<chrono::ChQuaternion<double>_>::~ChNameValue(&local_340);
  dVar1 = m_double;
  chrono::make_ChNameValue<myEmployeeBoss>(&local_358,"m_boss",(myEmployeeBoss *)&a_vect,'\0');
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_358);
  chrono::ChNameValue<myEmployeeBoss>::~ChNameValue(&local_358);
  dVar1 = m_double;
  chrono::make_ChNameValue<chrono::ChVector<double>*>
            (&local_370,(chrono *)"a_vect",(char *)&a_null_ptr,(ChVector<double> **)0x0,cVar7);
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_370);
  chrono::ChNameValue<chrono::ChVector<double>_*>::~ChNameValue(&local_370);
  dVar1 = m_double;
  chrono::make_ChNameValue<chrono::ChVector<double>*>
            ((ChNameValue<chrono::ChVector<double>_*> *)&a_boss,(chrono *)"a_null_ptr",local_208,
             (ChVector<double> **)0x0,cVar7);
  chrono::ChArchiveIn::operator>>
            ((ChArchiveIn *)dVar1,(ChNameValue<chrono::ChVector<double>_*> *)&a_boss);
  chrono::ChNameValue<chrono::ChVector<double>_*>::~ChNameValue
            ((ChNameValue<chrono::ChVector<double>_*> *)&a_boss);
  dVar1 = m_double;
  local_390 = (myEmployee *)0x0;
  chrono::make_ChNameValue<myEmployee*>
            ((ChNameValue<myEmployee_*> *)&a_boss2,(chrono *)"a_boss",(char *)&local_390,
             (myEmployee **)0x0,cVar7);
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,(ChNameValue<myEmployee_*> *)&a_boss2);
  chrono::ChNameValue<myEmployee_*>::~ChNameValue((ChNameValue<myEmployee_*> *)&a_boss2);
  dVar1 = m_double;
  local_3b0 = (myEmployee *)0x0;
  chrono::make_ChNameValue<myEmployee*>
            ((ChNameValue<myEmployee_*> *)
             &s_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (chrono *)"a_boss2",(char *)&local_3b0,(myEmployee **)0x0,cVar7);
  chrono::ChArchiveIn::operator>>
            ((ChArchiveIn *)dVar1,
             (ChNameValue<myEmployee_*> *)
             &s_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  chrono::ChNameValue<myEmployee_*>::~ChNameValue
            ((ChNameValue<myEmployee_*> *)
             &s_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<myEmployeeBoss>::shared_ptr
            ((shared_ptr<myEmployeeBoss> *)local_3d8,(nullptr_t)0x0);
  dVar1 = m_double;
  chrono::make_ChNameValue<std::shared_ptr<myEmployeeBoss>>
            ((ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)
             &s_boss_b.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (chrono *)"s_boss",(char *)local_3d8,(shared_ptr<myEmployeeBoss> *)0x0,cVar7);
  chrono::ChArchiveIn::operator>>
            ((ChArchiveIn *)dVar1,
             (ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)
             &s_boss_b.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  chrono::ChNameValue<std::shared_ptr<myEmployeeBoss>_>::~ChNameValue
            ((ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)
             &s_boss_b.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<myEmployeeBoss>::shared_ptr
            ((shared_ptr<myEmployeeBoss> *)local_400,(nullptr_t)0x0);
  dVar1 = m_double;
  chrono::make_ChNameValue<std::shared_ptr<myEmployeeBoss>>
            ((ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)
             &null_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (chrono *)"s_boss_b",(char *)local_400,(shared_ptr<myEmployeeBoss> *)0x0,cVar7);
  chrono::ChArchiveIn::operator>>
            ((ChArchiveIn *)dVar1,
             (ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)
             &null_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  chrono::ChNameValue<std::shared_ptr<myEmployeeBoss>_>::~ChNameValue
            ((ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)
             &null_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<myEmployeeBoss>::shared_ptr
            ((shared_ptr<myEmployeeBoss> *)local_428,(nullptr_t)0x0);
  dVar1 = m_double;
  chrono::make_ChNameValue<std::shared_ptr<myEmployeeBoss>>
            ((ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)&mcustomconstr,(chrono *)"null_boss",
             (char *)local_428,(shared_ptr<myEmployeeBoss> *)0x0,cVar7);
  chrono::ChArchiveIn::operator>>
            ((ChArchiveIn *)dVar1,(ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)&mcustomconstr);
  chrono::ChNameValue<std::shared_ptr<myEmployeeBoss>_>::~ChNameValue
            ((ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)&mcustomconstr);
  dVar1 = m_double;
  local_448 = (myEmployeeCustomConstructor *)0x0;
  chrono::make_ChNameValue<myEmployeeCustomConstructor*>
            ((ChNameValue<myEmployeeCustomConstructor_*> *)
             &vect_of_pointers.
              super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(chrono *)"mcustomconstr",
             (char *)&local_448,(myEmployeeCustomConstructor **)0x0,cVar7);
  chrono::ChArchiveIn::operator>>
            ((ChArchiveIn *)dVar1,
             (ChNameValue<myEmployeeCustomConstructor_*> *)
             &vect_of_pointers.
              super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  chrono::ChNameValue<myEmployeeCustomConstructor_*>::~ChNameValue
            ((ChNameValue<myEmployeeCustomConstructor_*> *)
             &vect_of_pointers.
              super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::vector
            ((vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> *)
             &mvp1);
  this = (ChVector<double> *)operator_new(0x18);
  chrono::ChVector<double>::ChVector(this,5.0,6.0,7.0);
  local_480 = this;
  chrono::ChArchiveIn::RebindExternalPointer((ChArchiveIn *)m_double,this,0x3e9);
  dVar1 = m_double;
  chrono::
  make_ChNameValue<std::vector<chrono::ChVector<double>*,std::allocator<chrono::ChVector<double>*>>>
            (&local_498,(chrono *)"vect_of_pointers",(char *)&mvp1,
             (vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> *)0x0,
             cVar7);
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_498);
  chrono::
  ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
  ::~ChNameValue(&local_498);
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar3 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar3,"\n\nSome results of deserialization I/O: \n\n");
  pCVar3 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar3,m_string.field_2._M_local_buf + 0xc);
  pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," \n");
  pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,m_array[2]._4_4_);
  pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3," \n");
  pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,dStack_18);
  chrono::ChStreamOutAscii::operator<<(pCVar3,"\n");
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar3,(Matrix<double,_2,_3,_1,_2,_3> *)(m_vect.m_data + 2));
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar3,(ChVector<double> *)(m_quat.m_data + 3));
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar3,(ChQuaternion<double> *)((long)&m_boss.slave.name.field_2 + 8));
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,pcVar4);
  chrono::ChStreamOutAscii::operator<<(pCVar3,"\n");
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar3,(vector<double,_std::allocator<double>_> *)
                            &m_stllist.
                             super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                             ._M_impl._M_node._M_size);
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar3,(pair<int,_double> *)local_a8);
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar3,(unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&m_matr_dyn.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                m_storage.m_cols);
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar3,(myEmployeeBoss *)&a_vect);
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar3,&a_null_ptr);
  if (local_390 != (myEmployee *)0x0) {
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar3,"\n\n We loaded an obj inherited from myEmployee class:\n");
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::operator<<(pCVar3,&local_390);
  }
  if (local_3b0 != (myEmployee *)0x0) {
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar3,
               "\n\n We loaded a 2nd obj inherited from myEmployee class (referencing the 1st):\n");
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::operator<<(pCVar3,&local_3b0);
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_3d8);
  if (bVar2) {
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar3,"\n\n We loaded a 3nd obj inherited from myEmployee class:\n");
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::operator<<(pCVar3,(shared_ptr<myEmployeeBoss> *)local_3d8);
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar3 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar3,"(This object is handled by shared pointers, with ref.count=");
    lVar5 = std::__shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>::use_count
                      ((__shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2> *)local_3d8);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,(int)lVar5);
    chrono::ChStreamOutAscii::operator<<(pCVar3,")\n");
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_428);
  if (!bVar2) {
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar3,"\n\n We tried to load a 4th obj with shared pointer, but was null.\n");
  }
  if (local_448 != (myEmployeeCustomConstructor *)0x0) {
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar3,
               "\n\n We loaded a 5th object with non-default constructor with 2 parameters.\n");
    pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::operator<<(pCVar3,&local_448);
  }
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar3,"\n\n We loaded a 6th object where sub-objects were unbind/rebind using IDs:\n")
  ;
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar3,(vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
                             *)&mvp1);
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  ppCVar6 = std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::
            operator[]((vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
                        *)&mvp1,0);
  chrono::operator<<(pCVar3,*ppCVar6);
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  ppCVar6 = std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::
            operator[]((vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
                        *)&mvp1,1);
  chrono::operator<<(pCVar3,*ppCVar6);
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar3,"\n");
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar3 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar3,"loaded object is a myEmployee?     :");
  pCVar3 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar3,local_390 != (myEmployee *)0x0);
  chrono::ChStreamOutAscii::operator<<(pCVar3,"\n");
  pCVar3 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar3 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar3,"loaded object is a myEmployeeBoss? :");
  if (local_390 == (myEmployee *)0x0) {
    local_6d0 = 0;
  }
  else {
    local_6d0 = __dynamic_cast(local_390,&myEmployee::typeinfo,&myEmployeeBoss::typeinfo,0);
  }
  pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,local_6d0 != 0);
  chrono::ChStreamOutAscii::operator<<(pCVar3,"\n");
  if (local_390 != (myEmployee *)0x0) {
    (*local_390->_vptr_myEmployee[1])();
  }
  std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::~vector
            ((vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> *)
             &mvp1);
  std::shared_ptr<myEmployeeBoss>::~shared_ptr((shared_ptr<myEmployeeBoss> *)local_428);
  std::shared_ptr<myEmployeeBoss>::~shared_ptr((shared_ptr<myEmployeeBoss> *)local_400);
  std::shared_ptr<myEmployeeBoss>::~shared_ptr((shared_ptr<myEmployeeBoss> *)local_3d8);
  myEmployeeBoss::~myEmployeeBoss((myEmployeeBoss *)&a_vect);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_1,__1,__1> *)
             (m_matr_NM.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>.m_storage.
              m_data.array + 5));
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *)&m_matr_dyn.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                       m_storage.m_cols);
  std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::~list
            ((list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
             &m_stlpair.second);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &m_stllist.
              super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              ._M_impl._M_node._M_size);
  std::__cxx11::string::~string
            ((string *)
             &m_stlvector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void my_deserialization_example(ChArchiveIn& marchive)
{  
        // Read from persistent binary file to transient data
        double m_double;
        int m_int;
        double m_array[3];
        char m_text[12]; // better use std::string
        std::string m_string;
        std::vector< double > m_stlvector;
        std::list< ChVector<> > m_stllist;
        std::pair<int, double> m_stlpair;
        std::unordered_map<int, double> m_stlunorderedmap;
        ChMatrixDynamic<> m_matr_dyn;
		ChMatrixNM<double, 2,3> m_matr_NM;
        ChVector<> m_vect;
        ChQuaternion<> m_quat;
        myEmployeeBoss m_boss;
        ChVector<>* a_vect;
        ChVector<>* a_null_ptr;

        marchive >> CHNVP(m_double,"custom_double");  // deserialize data n.1
        marchive >> CHNVP(m_int);     // deserialize data n.2
        marchive >> CHNVP(m_array);   // deserialize data n.3
        marchive >> CHNVP(m_text);    // deserialize data n....
        marchive >> CHNVP(m_string);  
        marchive >> CHNVP(m_stlvector);
        marchive >> CHNVP(m_stllist);
        marchive >> CHNVP(m_stlpair);
        marchive >> CHNVP(m_stlunorderedmap);
        marchive >> CHNVP(m_matr_dyn);
		marchive >> CHNVP(m_matr_NM);
        marchive >> CHNVP(m_vect);  
        marchive >> CHNVP(m_quat, "m_quaternion", NVP_TRACK_OBJECT);        

        // Also deserialize the C++ object
        marchive >> CHNVP(m_boss); 

        // Also deserialize the C++ pointer: an object will be created!
        marchive >> CHNVP(a_vect); 

        // Also deserialize the null C++ pointer: no object is created, and pointer set as null.
        marchive >> CHNVP(a_null_ptr);

        // Also retrieve c++ objects, referenced by a base class pointer, using the
        // class abstraction (class factory) mechanism, so that it
        // can be loaded even if we do not know if it was an object of
        // the base class 'myEmployee' or the specialized 'myEmployeeBoss' class..
        myEmployee* a_boss = 0;
        marchive >> CHNVP(a_boss);  // object will be created

        // Since the two pointers a_boss and a_boss2 were serialized when pointing to 
        // the same object instance, now the following will Not create another copy but will
        // automatically point to the same object of a_boss. 
        myEmployee* a_boss2 = 0;
        marchive >> CHNVP(a_boss2); 


        // Deserialize c++ objects referenced by shared pointers.
        // If classes of pointed objects used CH_FACTORY_REGISTER, class abstraction
        // will be automatically used.
        std::shared_ptr<myEmployeeBoss> s_boss(0);
        marchive >> CHNVP(s_boss);

        // Deserialize a shared pointer pointing to the same resource of s_boss.
        // Since the two pointers s_boss and s_boss_b were serialized when pointing to 
        // the same object instance, do not create new, but just point to the same of s_boss. 
        // Also, the shared pointer reference count is increased automatically.
        std::shared_ptr<myEmployeeBoss> s_boss_b(0);
        marchive >> CHNVP(s_boss_b);

        // Deserialize a null shared pointer
        std::shared_ptr<myEmployeeBoss> null_boss(0);
        marchive >> CHNVP(null_boss);

        // Deserialize an object with non-default constructor:
        myEmployeeCustomConstructor* mcustomconstr = 0;
        marchive >> CHNVP(mcustomconstr); 

        // Deserialize an object where some pointers are re-linked from external pre-existing objects,
        // marking them with unique IDs. Assume a ChVector is already here. 
        std::vector<ChVector<>*> vect_of_pointers;
        ChVector<>* mvp1 = new ChVector<>(5,6,7);
        marchive.RebindExternalPointer(mvp1, 1001); // use unique identifier > 0
        marchive >> CHNVP(vect_of_pointers);



        // Just for safety, log some of the restored data:

        GetLog() << "\n\nSome results of deserialization I/O: \n\n" << m_text << " \n" << m_int << " \n" << m_double << "\n";
        GetLog() << m_matr_NM;
        GetLog() << m_vect;
        GetLog() << m_quat;
        GetLog() << m_string.c_str() << "\n";
        GetLog() << m_stlvector;
        GetLog() << m_stlpair;
        GetLog() << m_stlunorderedmap;
        GetLog() << m_boss;
        GetLog() << a_vect;

        if (a_boss) {
            GetLog() << "\n\n We loaded an obj inherited from myEmployee class:\n";
            GetLog() << a_boss;
        }
        if (a_boss2) {
            GetLog() << "\n\n We loaded a 2nd obj inherited from myEmployee class (referencing the 1st):\n";
            GetLog() << a_boss2;
        }
        if (s_boss) {
            GetLog() << "\n\n We loaded a 3nd obj inherited from myEmployee class:\n";
            GetLog() << s_boss;
            GetLog() << "(This object is handled by shared pointers, with ref.count=" << (int)s_boss.use_count() << ")\n";
        }
        if (!null_boss) {
            GetLog() << "\n\n We tried to load a 4th obj with shared pointer, but was null.\n";
        }
        if (mcustomconstr) {
            GetLog() << "\n\n We loaded a 5th object with non-default constructor with 2 parameters.\n";
            GetLog() << mcustomconstr;
        }
        GetLog() << "\n\n We loaded a 6th object where sub-objects were unbind/rebind using IDs:\n";
        GetLog() << vect_of_pointers;
        GetLog() << *vect_of_pointers[0];
        GetLog() << *vect_of_pointers[1];


        GetLog() << "\n";
        GetLog() << "loaded object is a myEmployee?     :" << (dynamic_cast<myEmployee*>(a_boss) !=nullptr) << "\n";
        GetLog() << "loaded object is a myEmployeeBoss? :" << (dynamic_cast<myEmployeeBoss*>(a_boss) !=nullptr) << "\n";

        delete a_boss;
}